

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

bool __thiscall SoftHSM::RFC5652Unpad(SoftHSM *this,ByteString *padded,size_t blocksize)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  int lineNo;
  bool bVar4;
  char *format;
  ulong uVar5;
  
  sVar2 = ByteString::size(padded);
  if (sVar2 % blocksize == 0) {
    pbVar3 = ByteString::operator[](padded,sVar2 - 1);
    bVar1 = *pbVar3;
    uVar5 = (ulong)bVar1;
    if ((bVar1 == 0) || (blocksize < uVar5)) {
      format = "invalid padbyte value %d, larger than blocksize %d";
      lineNo = 0x1852;
LAB_0014185b:
      bVar4 = false;
      softHSMLog(7,"RFC5652Unpad",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,lineNo,format,uVar5,blocksize);
    }
    else {
      blocksize = sVar2 - uVar5;
      if (uVar5 <= sVar2) {
        do {
          pbVar3 = ByteString::operator[](padded,blocksize);
          if (*pbVar3 != bVar1) {
            pbVar3 = ByteString::operator[](padded,blocksize);
            uVar5 = (ulong)*pbVar3;
            format = "invalid padding byte %d at position %d";
            lineNo = 0x185a;
            goto LAB_0014185b;
          }
          blocksize = blocksize + 1;
        } while (blocksize < sVar2);
      }
      ByteString::resize(padded,sVar2 - uVar5);
      bVar4 = true;
    }
  }
  else {
    bVar4 = false;
    softHSMLog(7,"RFC5652Unpad",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x184a,"padded buffer length %d is not a multiple of %d",sVar2,blocksize);
  }
  return bVar4;
}

Assistant:

bool SoftHSM::RFC5652Unpad(ByteString &padded, size_t blocksize)
{
	auto wrappedlen = padded.size();

	if( wrappedlen % blocksize != 0)
	{
		DEBUG_MSG("padded buffer length %d is not a multiple of %d", wrappedlen, blocksize);
		return false;
	}

	auto padbyte = padded[wrappedlen-1];

	if( padbyte == 0 || padbyte > blocksize )
	{
		DEBUG_MSG("invalid padbyte value %d, larger than blocksize %d", padbyte, blocksize);
		return false;
	}

	for(auto i = wrappedlen-padbyte; i<wrappedlen; i++)
	{
		if( padded[i] != padbyte )
		{
			DEBUG_MSG("invalid padding byte %d at position %d", padded[i], i);
			return false;
		}
	}

	padded.resize(wrappedlen - padbyte); // forget padding
	return true;
}